

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<std::complex<long_double>_>::ExtractCoarse
          (TPZDohrAssembly<std::complex<long_double>_> *this,int isub,
          TPZFMatrix<std::complex<long_double>_> *global,
          TPZFMatrix<std::complex<long_double>_> *local)

{
  TPZVec<int> *this_00;
  int64_t iVar1;
  int64_t iVar2;
  int *piVar3;
  complex<long_double> *pcVar4;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  int in_ESI;
  long in_RDI;
  int ic;
  int ncols;
  int ieq;
  int neq;
  TPZVec<int> *avec;
  undefined8 local_58;
  int64_t in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffc0;
  int local_38;
  int local_30;
  
  this_00 = TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 0x28),(long)in_ESI);
  iVar1 = TPZVec<int>::NElements(this_00);
  iVar2 = TPZBaseMatrix::Cols(in_RDX);
  (**(code **)(*in_RCX + 0x68))(in_RCX,(long)(int)iVar1,(long)(int)iVar2);
  for (local_38 = 0; local_38 < (int)iVar2; local_38 = local_38 + 1) {
    for (local_30 = 0; local_30 < (int)iVar1; local_30 = local_30 + 1) {
      piVar3 = TPZVec<int>::operator[](this_00,(long)local_30);
      (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])
                (&local_58,in_RDX,(long)*piVar3,(long)local_38);
      pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb0);
      *(undefined8 *)pcVar4->_M_value = local_58;
      *(int64_t *)(pcVar4->_M_value + 8) = in_stack_ffffffffffffffb0;
      *(int64_t *)(pcVar4->_M_value + 0x10) = in_stack_ffffffffffffffb8;
      *(TPZFMatrix<std::complex<long_double>_> **)(pcVar4->_M_value + 0x18) =
           in_stack_ffffffffffffffc0;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::ExtractCoarse(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = global.Cols();
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
}